

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind.cc
# Opt level: O3

string * __thiscall
absl::lts_20240722::str_format_internal::Summarize_abi_cxx11_
          (string *__return_storage_ptr__,str_format_internal *this,UntypedFormatSpecImpl format,
          Span<const_absl::lts_20240722::str_format_internal::FormatArgImpl> args)

{
  str_format_internal *p;
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  void *pvVar4;
  pointer pFVar5;
  int *next_arg_00;
  code *pcVar6;
  undefined8 extraout_RDX;
  size_t extraout_RDX_00;
  code *extraout_RDX_02;
  ConversionItem *item;
  char *pcVar7;
  str_format_internal *end;
  char *pcVar8;
  char *pcVar9;
  string_view v;
  string_view v_00;
  string_view v_01;
  string_view v_02;
  string_view conv_string;
  string_view conv_string_00;
  string_view conv_string_01;
  int next_arg;
  FormatSinkImpl sink;
  int local_4a4;
  string *local_4a0;
  ConverterConsumer<absl::lts_20240722::str_format_internal::(anonymous_namespace)::SummarizingConverter>
  local_498;
  UnboundConversion local_480;
  _Alloc_hider local_470;
  size_type local_468;
  char local_460;
  undefined7 uStack_45f;
  undefined8 uStack_458;
  FormatSinkImpl local_450;
  code *extraout_RDX_01;
  
  pFVar5 = (pointer)format.size_;
  pvVar4 = format.data_;
  local_498.arg_context_.pack_.len_ = (size_type)args.ptr_;
  local_470._M_p = &local_460;
  local_468 = 0;
  local_460 = '\0';
  local_450.raw_.sink_ = &local_470;
  local_450.pos_ = local_450.buf_;
  pcVar6 = FormatRawSinkImpl::Flush<std::__cxx11::string>;
  local_450.raw_.write_ = FormatRawSinkImpl::Flush<std::__cxx11::string>;
  local_450.size_ = 0;
  local_498.converter_.sink_ = &local_450;
  local_4a0 = __return_storage_ptr__;
  local_498.arg_context_.pack_.ptr_ = pFVar5;
  if (pvVar4 == (void *)0xffffffffffffffff) {
    pcVar7 = *(char **)(this + 0x10);
    pcVar1 = *(char **)(this + 0x18);
    if (pcVar7 != pcVar1) {
      pcVar2 = *(char **)(this + 8);
      pcVar9 = (char *)0x0;
      pcVar8 = pcVar2;
      do {
        pcVar8 = pcVar8 + (long)pcVar9;
        pcVar9 = pcVar2 + (*(long *)(pcVar7 + 8) - (long)pcVar8);
        if (*pcVar7 == '\x01') {
          conv_string_01._M_str = (char *)pFVar5;
          conv_string_01._M_len = (size_t)pcVar6;
          bVar3 = anon_unknown_3::
                  ConverterConsumer<absl::lts_20240722::str_format_internal::(anonymous_namespace)::SummarizingConverter>
                  ::ConvertOne(&local_498,(UnboundConversion *)(pcVar7 + 0x10),conv_string_01);
          pcVar6 = extraout_RDX_01;
          if (!bVar3) goto LAB_0010a96b;
        }
        else {
          v_01._M_str = pcVar8;
          v_01._M_len = (size_t)pcVar9;
          FormatSinkImpl::Append(&local_450,v_01);
          pcVar6 = extraout_RDX_02;
        }
        pcVar7 = pcVar7 + 0x20;
      } while (pcVar7 != pcVar1);
    }
    if (*this != (str_format_internal)0x0) {
LAB_0010a96b:
      (local_4a0->_M_dataplus)._M_p = (pointer)&local_4a0->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4a0,"");
      FormatSinkImpl::~FormatSinkImpl(&local_450);
      if (local_470._M_p == &local_460) {
        return local_4a0;
      }
      operator_delete(local_470._M_p,CONCAT71(uStack_45f,local_460) + 1);
      return local_4a0;
    }
  }
  else {
    local_4a4 = 0;
    if (pvVar4 != (void *)0x0) {
      end = (str_format_internal *)((long)pvVar4 + (long)this);
      do {
        pvVar4 = memchr(this,0x25,(long)end - (long)this);
        if (pvVar4 == (void *)0x0) {
          v_02._M_str = (char *)this;
          v_02._M_len = (long)end - (long)this;
          FormatSinkImpl::Append(local_498.converter_.sink_,v_02);
          break;
        }
        v._M_len = (long)pvVar4 - (long)this;
        v._M_str = (char *)this;
        FormatSinkImpl::Append(local_498.converter_.sink_,v);
        p = (str_format_internal *)((long)pvVar4 + 1);
        if (end <= p) goto LAB_0010a96b;
        if ((char)ConvTagHolder::value[(byte)*p].tag_ < '\0') {
          if (*p == (str_format_internal)0x25) {
            v_00._M_str = "%";
            v_00._M_len = 1;
            FormatSinkImpl::Append(local_498.converter_.sink_,v_00);
            goto LAB_0010a8ab;
          }
          local_480.width.value_ = -1;
          local_480.precision.value_ = -1;
          local_480.flags = kBasic;
          local_480.length_mod = none;
          local_480.conv = 0x13;
          next_arg_00 = &local_4a4;
          this = (str_format_internal *)
                 ConsumeUnboundConversionNoInline((char *)p,(char *)end,&local_480,next_arg_00);
          if ((this == (str_format_internal *)0x0) ||
             (conv_string_00._M_str = (char *)next_arg_00, conv_string_00._M_len = extraout_RDX_00,
             bVar3 = anon_unknown_3::
                     ConverterConsumer<absl::lts_20240722::str_format_internal::(anonymous_namespace)::SummarizingConverter>
                     ::ConvertOne(&local_498,&local_480,conv_string_00), !bVar3)) goto LAB_0010a96b;
        }
        else {
          if (local_4a4 < 0) goto LAB_0010a96b;
          local_480.width.value_ = -1;
          local_480.precision.value_ = -1;
          local_480.flags = kBasic;
          local_480.length_mod = none;
          conv_string._M_str._0_4_ = local_4a4 + 1;
          conv_string._M_len = extraout_RDX;
          conv_string._M_str._4_4_ = 0;
          local_4a4 = (int)conv_string._M_str;
          local_480.arg_position = (int)conv_string._M_str;
          local_480.conv = ConvTagHolder::value[(byte)*p].tag_;
          bVar3 = anon_unknown_3::
                  ConverterConsumer<absl::lts_20240722::str_format_internal::(anonymous_namespace)::SummarizingConverter>
                  ::ConvertOne(&local_498,&local_480,conv_string);
          if (!bVar3) goto LAB_0010a96b;
LAB_0010a8ab:
          this = (str_format_internal *)((long)pvVar4 + 2);
        }
      } while (this != end);
    }
  }
  FormatSinkImpl::~FormatSinkImpl(&local_450);
  (local_4a0->_M_dataplus)._M_p = (pointer)&local_4a0->field_2;
  if (local_470._M_p == &local_460) {
    (local_4a0->field_2)._M_allocated_capacity = CONCAT71(uStack_45f,local_460);
    *(undefined8 *)((long)&local_4a0->field_2 + 8) = uStack_458;
  }
  else {
    (local_4a0->_M_dataplus)._M_p = local_470._M_p;
    (local_4a0->field_2)._M_allocated_capacity = CONCAT71(uStack_45f,local_460);
  }
  local_4a0->_M_string_length = local_468;
  return local_4a0;
}

Assistant:

std::string Summarize(const UntypedFormatSpecImpl format,
                      absl::Span<const FormatArgImpl> args) {
  typedef SummarizingConverter Converter;
  std::string out;
  {
    // inner block to destroy sink before returning out. It ensures a last
    // flush.
    FormatSinkImpl sink(&out);
    if (!ConvertAll(format, args, Converter(&sink))) {
      return "";
    }
  }
  return out;
}